

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.hh
# Opt level: O2

bool __thiscall
tchecker::
cartesian_iterator_t<tchecker::range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>_>
::operator==(cartesian_iterator_t<tchecker::range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>_>
             *this,cartesian_iterator_t<tchecker::range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>_>
                   *it)

{
  bool bVar1;
  
  if (this->_nranges == it->_nranges) {
    bVar1 = std::operator==(&this->_begins,&it->_begins);
    if (bVar1) {
      bVar1 = std::operator==(&this->_ends,&it->_ends);
      if (bVar1) {
        bVar1 = std::operator==(&this->_its,&it->_its);
        return bVar1;
      }
    }
  }
  return false;
}

Assistant:

bool operator==(tchecker::cartesian_iterator_t<R> const & it) const
  {
    return ((_nranges == it._nranges) && (_begins == it._begins) && (_ends == it._ends) && (_its == it._its));
  }